

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O0

int __thiscall SQLite::Statement::bind(Statement *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int aRet;
  int extraout_EAX;
  sqlite3_stmt *pStmt;
  double in_XMM0_Qa;
  int ret;
  double aValue_local;
  int aIndex_local;
  Statement *this_local;
  
  pStmt = Ptr::operator_cast_to_sqlite3_stmt_(&this->mStmtPtr);
  aRet = sqlite3_bind_double(pStmt,__fd,in_XMM0_Qa);
  check(this,aRet);
  return extraout_EAX;
}

Assistant:

void Statement::bind(const int aIndex, const double aValue)
{
    const int ret = sqlite3_bind_double(mStmtPtr, aIndex, aValue);
    check(ret);
}